

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetValueTypeString(VALUE_TYPE Val)

{
  int iVar1;
  Char *pCVar2;
  VALUE_TYPE Val_local;
  
  if (GetValueTypeString(Diligent::VALUE_TYPE)::ValueTypeStrings == '\0') {
    iVar1 = __cxa_guard_acquire(&GetValueTypeString(Diligent::VALUE_TYPE)::ValueTypeStrings);
    if (iVar1 != 0) {
      GetValueTypeString::ValueTypeToStringMap::ValueTypeToStringMap
                (&GetValueTypeString::ValueTypeStrings);
      __cxa_guard_release(&GetValueTypeString(Diligent::VALUE_TYPE)::ValueTypeStrings);
    }
  }
  pCVar2 = GetValueTypeString(Diligent::VALUE_TYPE)::ValueTypeToStringMap::operator[](Diligent::
           VALUE_TYPE__const(&GetValueTypeString::ValueTypeStrings,Val);
  return pCVar2;
}

Assistant:

const Char* GetValueTypeString(VALUE_TYPE Val)
{
    struct ValueTypeToStringMap
    {
        ValueTypeToStringMap()
        {
#define INIT_VALUE_TYPE_STR(ValType) ValueTypeStrings[ValType] = #ValType
            INIT_VALUE_TYPE_STR(VT_UNDEFINED);
            INIT_VALUE_TYPE_STR(VT_INT8);
            INIT_VALUE_TYPE_STR(VT_INT16);
            INIT_VALUE_TYPE_STR(VT_INT32);
            INIT_VALUE_TYPE_STR(VT_UINT8);
            INIT_VALUE_TYPE_STR(VT_UINT16);
            INIT_VALUE_TYPE_STR(VT_UINT32);
            INIT_VALUE_TYPE_STR(VT_FLOAT16);
            INIT_VALUE_TYPE_STR(VT_FLOAT32);
            INIT_VALUE_TYPE_STR(VT_FLOAT64);
#undef INIT_VALUE_TYPE_STR
            static_assert(VT_NUM_TYPES == 10, "Not all value type strings are initialized.");
        }

        const Char* operator[](VALUE_TYPE Val) const
        {
            if (Val < ValueTypeStrings.size())
            {
                return ValueTypeStrings[Val];
            }
            else
            {
                UNEXPECTED("Incorrect value type (", static_cast<Uint32>(Val), ")");
                return "unknown value type";
            }
        }

    private:
        std::array<const Char*, VT_NUM_TYPES> ValueTypeStrings{};
    };

    static const ValueTypeToStringMap ValueTypeStrings;
    return ValueTypeStrings[Val];
}